

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speaker_positioning.c
# Opt level: O1

float set_side_length(mixed_channel_t set,vbap_data *data)

{
  float (*pafVar1) [3];
  float fVar2;
  byte bVar3;
  byte bVar4;
  double dVar5;
  float (*pafVar6) [3];
  undefined3 in_register_00000039;
  uint uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float local_58;
  
  uVar7 = CONCAT31(in_register_00000039,set);
  bVar3 = data->sets[uVar7].speakers[0];
  pafVar1 = data->speakers + data->sets[uVar7].speakers[1];
  bVar4 = data->sets[uVar7].speakers[2];
  fVar12 = data->speakers[bVar3][0];
  fVar14 = data->speakers[bVar3][1];
  fVar13 = (*pafVar1)[1];
  fVar16 = (*pafVar1)[0];
  fVar15 = data->speakers[bVar3][2];
  fVar11 = (*pafVar1)[2];
  fVar8 = fVar15 * fVar15 + fVar12 * fVar12 + fVar14 * fVar14;
  if (fVar8 < 0.0) {
    fVar8 = sqrtf(fVar8);
  }
  else {
    fVar8 = SQRT(fVar8);
  }
  fVar9 = (*pafVar1)[2] * (*pafVar1)[2] +
          (*pafVar1)[0] * (*pafVar1)[0] + (*pafVar1)[1] * (*pafVar1)[1];
  if (fVar9 < 0.0) {
    fVar9 = sqrtf(fVar9);
  }
  else {
    fVar9 = SQRT(fVar9);
  }
  fVar14 = (fVar11 * fVar15 + fVar16 * fVar12 + fVar13 * fVar14) / (fVar8 * fVar9);
  pafVar6 = data->speakers + bVar4;
  fVar12 = 0.0;
  if (fVar14 <= 1.0) {
    if (-1.0 <= fVar14) {
      dVar5 = acos((double)fVar14);
      fVar12 = ABS((float)dVar5);
    }
    else {
      fVar12 = 3.1415927;
    }
  }
  fVar14 = data->speakers[bVar3][0];
  fVar13 = data->speakers[bVar3][1];
  fVar16 = data->speakers[bVar4][1];
  fVar15 = (*pafVar6)[0];
  fVar11 = data->speakers[bVar3][2];
  fVar8 = data->speakers[bVar4][2];
  fVar9 = fVar11 * fVar11 + fVar14 * fVar14 + fVar13 * fVar13;
  if (fVar9 < 0.0) {
    fVar9 = sqrtf(fVar9);
  }
  else {
    fVar9 = SQRT(fVar9);
  }
  fVar10 = data->speakers[bVar4][1];
  fVar2 = data->speakers[bVar4][2];
  fVar10 = fVar2 * fVar2 + (*pafVar6)[0] * (*pafVar6)[0] + fVar10 * fVar10;
  local_58 = 0.0;
  if (fVar10 < 0.0) {
    fVar10 = sqrtf(fVar10);
  }
  else {
    fVar10 = SQRT(fVar10);
  }
  fVar14 = (fVar8 * fVar11 + fVar15 * fVar14 + fVar16 * fVar13) / (fVar9 * fVar10);
  if (fVar14 <= 1.0) {
    if (-1.0 <= fVar14) {
      dVar5 = acos((double)fVar14);
      local_58 = ABS((float)dVar5);
    }
    else {
      local_58 = 3.1415927;
    }
  }
  fVar14 = (*pafVar1)[0];
  fVar13 = (*pafVar1)[1];
  fVar16 = data->speakers[bVar4][1];
  fVar15 = (*pafVar6)[0];
  fVar11 = (*pafVar1)[2];
  fVar8 = data->speakers[bVar4][2];
  fVar9 = fVar11 * fVar11 + fVar14 * fVar14 + fVar13 * fVar13;
  if (fVar9 < 0.0) {
    fVar9 = sqrtf(fVar9);
  }
  else {
    fVar9 = SQRT(fVar9);
  }
  fVar10 = data->speakers[bVar4][1];
  fVar2 = data->speakers[bVar4][2];
  fVar10 = fVar2 * fVar2 + (*pafVar6)[0] * (*pafVar6)[0] + fVar10 * fVar10;
  if (fVar10 < 0.0) {
    fVar10 = sqrtf(fVar10);
  }
  else {
    fVar10 = SQRT(fVar10);
  }
  fVar13 = (fVar8 * fVar11 + fVar15 * fVar14 + fVar16 * fVar13) / (fVar9 * fVar10);
  fVar14 = 0.0;
  if (fVar13 <= 1.0) {
    if (-1.0 <= fVar13) {
      dVar5 = acos((double)fVar13);
      fVar14 = ABS((float)dVar5);
    }
    else {
      fVar14 = 3.1415927;
    }
  }
  fVar14 = fVar12 + local_58 + fVar14;
  fVar12 = data->speakers[bVar3][0];
  fVar13 = data->speakers[bVar3][1];
  fVar16 = data->speakers[bVar3][2];
  fVar15 = fVar13 * (*pafVar1)[2] - (*pafVar1)[1] * fVar16;
  fVar16 = fVar16 * (*pafVar1)[0] - (*pafVar1)[2] * fVar12;
  fVar13 = fVar12 * (*pafVar1)[1] - (*pafVar1)[0] * fVar13;
  fVar12 = fVar13 * fVar13 + fVar15 * fVar15 + fVar16 * fVar16;
  if (fVar12 < 0.0) {
    fVar12 = sqrtf(fVar12);
  }
  else {
    fVar12 = SQRT(fVar12);
  }
  fVar11 = 0.0;
  if (1e-06 < fVar14) {
    if (0.0 < fVar12) {
      fVar15 = fVar15 / fVar12;
    }
    else {
      fVar15 = 0.0;
    }
    fVar11 = 0.0;
    if (0.0 < fVar12) {
      fVar11 = fVar16 / fVar12;
    }
    fVar11 = ABS((float)(-(uint)(0.0 < fVar12) & (uint)(fVar13 / fVar12)) * data->speakers[bVar4][2]
                 + fVar15 * (*pafVar6)[0] + fVar11 * data->speakers[bVar4][1]) / fVar14;
  }
  return fVar11;
}

Assistant:

float set_side_length(mixed_channel_t set, struct vbap_data *data){
  float cross[3];
  float *i = data->speakers[data->sets[set].speakers[0]];
  float *j = data->speakers[data->sets[set].speakers[1]];
  float *k = data->speakers[data->sets[set].speakers[2]];
  float length = fabsf(vec_angle(i, j))
                 + fabsf(vec_angle(i, k))
                 + fabsf(vec_angle(j, k));
  vec_cross(cross, i, j);
  if(0.000001 < length) return fabsf(vec_dot(cross, k)) / length;
  return 0.0;
}